

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_create_table.cpp
# Opt level: O1

unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true> __thiscall
duckdb::Transformer::TransformCreateTable(Transformer *this,PGCreateStmt *stmt)

{
  char cVar1;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> _Var2;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> _Var3;
  __node_base column;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  OnCreateConflict OVar4;
  Transformer *pTVar5;
  CreateTableInfo *this_01;
  pointer pCVar6;
  pointer pCVar7;
  NotImplementedException *pNVar8;
  ParserException *pPVar9;
  long in_RDX;
  long *plVar10;
  pointer *__ptr;
  PGListCell *pPVar11;
  templated_unique_single_t info;
  optional_ptr<duckdb_libpgquery::PGColumnDef,_true> pg_col_def;
  unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> constraint;
  optional_ptr<duckdb_libpgquery::PGNode,_true> node;
  optional_ptr<duckdb_libpgquery::PGConstraint,_true> pg_constraint_1;
  optional_ptr<duckdb_libpgquery::PGConstraint,_true> pg_constraint;
  QualifiedName qname;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> local_288;
  undefined1 local_280 [16];
  optional_ptr<duckdb_libpgquery::PGNode,_true> local_270;
  __buckets_ptr local_268;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_260;
  __node_base local_258;
  Transformer *local_250;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_248;
  undefined1 local_240 [32];
  LogicalType local_220;
  _Prime_rehash_policy local_208 [2];
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_1e8;
  Value local_1e0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  a_Stack_1a0 [56];
  QualifiedName local_168;
  undefined1 local_108 [32];
  LogicalType local_e8;
  _Prime_rehash_policy a_Stack_d0 [2];
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> local_b0
  ;
  Value local_a8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  a_Stack_68 [56];
  
  pTVar5 = (Transformer *)operator_new(0x80);
  CreateStatement::CreateStatement((CreateStatement *)pTVar5);
  (this->parent).ptr = pTVar5;
  this_01 = (CreateTableInfo *)operator_new(0x1d8);
  CreateTableInfo::CreateTableInfo(this_01);
  local_288._M_head_impl = this_01;
  if (*(long *)(in_RDX + 0x18) != 0) {
    pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_240._0_8_ = local_240 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_240,"inherited relations not implemented","");
    NotImplementedException::NotImplementedException(pNVar8,(string *)local_240);
    __cxa_throw(pNVar8,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pCVar6 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_288);
  ::std::__cxx11::string::_M_replace
            ((ulong)&(pCVar6->super_CreateInfo).catalog,0,
             (char *)(pCVar6->super_CreateInfo).catalog._M_string_length,0x1f09e61);
  TransformQualifiedName(&local_168,(Transformer *)stmt,*(PGRangeVar **)(in_RDX + 8));
  pCVar6 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_288);
  ::std::__cxx11::string::_M_assign((string *)&(pCVar6->super_CreateInfo).catalog);
  pCVar6 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_288);
  ::std::__cxx11::string::_M_assign((string *)&(pCVar6->super_CreateInfo).schema);
  pCVar6 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_288);
  pTVar5 = (Transformer *)&pCVar6->table;
  ::std::__cxx11::string::_M_assign((string *)pTVar5);
  OVar4 = TransformOnConflict(pTVar5,*(PGOnCreateConflict *)(in_RDX + 0x48));
  pCVar6 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_288);
  (pCVar6->super_CreateInfo).on_conflict = OVar4;
  cVar1 = *(char *)(*(long *)(in_RDX + 8) + 0x21);
  pCVar6 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_288);
  (pCVar6->super_CreateInfo).temporary = cVar1 == '\0';
  pCVar6 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_288);
  if (((pCVar6->super_CreateInfo).temporary == true) && (1 < *(uint *)(in_RDX + 0x38))) {
    pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_240._0_8_ = local_240 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_240,"Only ON COMMIT PRESERVE ROWS is supported","");
    NotImplementedException::NotImplementedException(pNVar8,(string *)local_240);
    __cxa_throw(pNVar8,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (*(long *)(in_RDX + 0x10) == 0) {
    pPVar9 = (ParserException *)__cxa_allocate_exception(0x10);
    local_240._0_8_ = local_240 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_240,"Table must have at least one column!","");
    ParserException::ParserException(pPVar9,(string *)local_240);
    __cxa_throw(pPVar9,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  plVar10 = *(long **)(*(long *)(in_RDX + 0x10) + 8);
  if (plVar10 != (long *)0x0) {
    local_248 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_108 + 0xa0);
    local_260 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_240 + 0xa0);
    local_268 = (__buckets_ptr)0x0;
    local_250 = (Transformer *)stmt;
    do {
      local_270.ptr = (PGNode *)*plVar10;
      optional_ptr<duckdb_libpgquery::PGNode,_true>::CheckValid(&local_270);
      if ((local_270.ptr)->type == T_PGColumnDef) {
        local_280._0_8_ = *plVar10;
        optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::CheckValid
                  ((optional_ptr<duckdb_libpgquery::PGColumnDef,_true> *)local_280);
        TransformColumnDefinition
                  ((ColumnDefinition *)local_240,(Transformer *)stmt,(PGColumnDef *)local_280._0_8_)
        ;
        optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::CheckValid
                  ((optional_ptr<duckdb_libpgquery::PGColumnDef,_true> *)local_280);
        if ((PGList *)
            (((case_insensitive_map_t<duckdb_libpgquery::PGWindowDef_*> *)(local_280._0_8_ + 0x58))
            ->_M_h)._M_buckets != (PGList *)0x0) {
          optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::CheckValid
                    ((optional_ptr<duckdb_libpgquery::PGColumnDef,_true> *)local_280);
          for (pPVar11 = ((PGList *)
                         (((case_insensitive_map_t<duckdb_libpgquery::PGWindowDef_*> *)
                          (local_280._0_8_ + 0x58))->_M_h)._M_buckets)->head;
              pPVar11 != (PGListCell *)0x0; pPVar11 = pPVar11->next) {
            local_258._M_nxt = (_Hash_node_base *)(pPVar11->data).ptr_value;
            optional_ptr<duckdb_libpgquery::PGConstraint,_true>::CheckValid
                      ((optional_ptr<duckdb_libpgquery::PGConstraint,_true> *)&local_258);
            column._M_nxt = local_258._M_nxt;
            unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
            ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                          *)&local_288);
            TransformConstraint((Transformer *)(local_280 + 8),(PGConstraint *)stmt,
                                (ColumnDefinition *)column._M_nxt,(idx_t)local_240);
            if ((ParserOptions *)local_280._8_8_ != (ParserOptions *)0x0) {
              pCVar6 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                                     *)&local_288);
              ::std::
              vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
                          *)&pCVar6->constraints,
                         (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                          *)(local_280 + 8));
            }
            if ((ParserOptions *)local_280._8_8_ != (ParserOptions *)0x0) {
              (**(code **)(*(long *)(bool *)local_280._8_8_ + 8))();
            }
          }
        }
        pCVar6 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                 ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                               *)&local_288);
        local_108._0_8_ = local_108 + 0x10;
        if ((PGConstraint *)local_240._0_8_ == (PGConstraint *)(local_240 + 0x10)) {
          local_108._24_8_ = local_240._24_8_;
        }
        else {
          local_108._0_8_ = local_240._0_8_;
        }
        local_108._17_7_ = local_240._17_7_;
        local_108[0x10] = local_240[0x10];
        local_108._8_8_ = local_240._8_8_;
        local_240._8_8_ = (__node_base_ptr)0x0;
        local_240[0x10] = AUTO_INCREMENT;
        local_240._0_8_ = (PGConstraint *)(local_240 + 0x10);
        LogicalType::LogicalType
                  ((LogicalType *)(local_108 + 0x20),(LogicalType *)(local_240 + 0x20));
        a_Stack_d0[1]._1_8_ = local_208[1]._1_8_;
        a_Stack_d0[0]._M_max_load_factor = local_208[0]._M_max_load_factor;
        a_Stack_d0[0]._4_4_ = local_208[0]._4_4_;
        local_b0._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
             (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
             local_1e8._M_head_impl;
        local_1e8._M_head_impl = (ParsedExpression *)0x0;
        Value::Value((Value *)(local_108 + 0x60),(Value *)(local_240 + 0x60));
        this_00 = local_248;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_Hashtable(local_248,local_260);
        ColumnList::AddColumn(&pCVar6->columns,(ColumnDefinition *)local_108);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(this_00);
        Value::~Value((Value *)(local_108 + 0x60));
        stmt = (PGCreateStmt *)local_250;
        if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             )local_b0._M_t.
              super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
              .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
            (ParsedExpression *)0x0) {
          (**(code **)((long)*(unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
                               *)local_b0._M_t.
                                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                                 _M_head_impl + 8))();
        }
        local_b0._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
             (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
              )0x0;
        LogicalType::~LogicalType((LogicalType *)(local_108 + 0x20));
        if ((PGConstraint *)local_108._0_8_ != (PGConstraint *)(local_108 + 0x10)) {
          operator_delete((void *)local_108._0_8_);
        }
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(local_260);
        Value::~Value((Value *)(local_240 + 0x60));
        if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             )local_1e8._M_head_impl != (ParsedExpression *)0x0) {
          (**(code **)((long)*(unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
                               *)local_1e8._M_head_impl + 8))();
        }
        local_1e8._M_head_impl = (ParsedExpression *)0x0;
        LogicalType::~LogicalType((LogicalType *)(local_240 + 0x20));
        if ((PGConstraint *)local_240._0_8_ != (PGConstraint *)(local_240 + 0x10)) {
          operator_delete((void *)local_240._0_8_);
        }
        local_268 = (__buckets_ptr)((long)local_268 + 1);
      }
      else {
        if ((local_270.ptr)->type != T_PGConstraint) {
          pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_240._0_8_ = local_240 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_240,"ColumnDef type not handled yet","");
          NotImplementedException::NotImplementedException(pNVar8,(string *)local_240);
          __cxa_throw(pNVar8,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error
                     );
        }
        local_240._0_8_ = *plVar10;
        pCVar6 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                 ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                               *)&local_288);
        optional_ptr<duckdb_libpgquery::PGConstraint,_true>::CheckValid
                  ((optional_ptr<duckdb_libpgquery::PGConstraint,_true> *)local_240);
        TransformConstraint((Transformer *)local_280,(PGConstraint *)stmt);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
                    *)&pCVar6->constraints,
                   (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
                   local_280);
        if ((Transformer *)local_280._0_8_ != (Transformer *)0x0) {
          (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_280._0_8_)->ptr->options)();
        }
      }
      _Var3._M_head_impl = local_288._M_head_impl;
      plVar10 = (long *)plVar10[1];
    } while (plVar10 != (long *)0x0);
    if (local_268 != (__buckets_ptr)0x0) {
      local_288._M_head_impl = (CreateTableInfo *)0x0;
      pCVar7 = unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true>
               ::operator->((unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true>
                             *)this);
      _Var2._M_head_impl =
           (pCVar7->info).
           super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
           super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
           super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
      (pCVar7->info).super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
      _M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
      super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl =
           &(_Var3._M_head_impl)->super_CreateInfo;
      if (_Var2._M_head_impl != (CreateInfo *)0x0) {
        (**(code **)(*(long *)&(_Var2._M_head_impl)->super_ParseInfo + 8))();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168.name._M_dataplus._M_p != &local_168.name.field_2) {
        operator_delete(local_168.name._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168.schema._M_dataplus._M_p != &local_168.schema.field_2) {
        operator_delete(local_168.schema._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168.catalog._M_dataplus._M_p != &local_168.catalog.field_2) {
        operator_delete(local_168.catalog._M_dataplus._M_p);
      }
      if (local_288._M_head_impl != (CreateTableInfo *)0x0) {
        (*((local_288._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
      }
      return (unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>_>)
             (unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>_>)
             this;
    }
  }
  pPVar9 = (ParserException *)__cxa_allocate_exception(0x10);
  local_240._0_8_ = local_240 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_240,"Table must have at least one column!","");
  ParserException::ParserException(pPVar9,(string *)local_240);
  __cxa_throw(pPVar9,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<CreateStatement> Transformer::TransformCreateTable(duckdb_libpgquery::PGCreateStmt &stmt) {
	auto result = make_uniq<CreateStatement>();
	auto info = make_uniq<CreateTableInfo>();

	if (stmt.inhRelations) {
		throw NotImplementedException("inherited relations not implemented");
	}
	D_ASSERT(stmt.relation);

	info->catalog = INVALID_CATALOG;
	auto qname = TransformQualifiedName(*stmt.relation);
	info->catalog = qname.catalog;
	info->schema = qname.schema;
	info->table = qname.name;
	info->on_conflict = TransformOnConflict(stmt.onconflict);
	info->temporary =
	    stmt.relation->relpersistence == duckdb_libpgquery::PGPostgresRelPersistence::PG_RELPERSISTENCE_TEMP;

	if (info->temporary && stmt.oncommit != duckdb_libpgquery::PGOnCommitAction::PG_ONCOMMIT_PRESERVE_ROWS &&
	    stmt.oncommit != duckdb_libpgquery::PGOnCommitAction::PG_ONCOMMIT_NOOP) {
		throw NotImplementedException("Only ON COMMIT PRESERVE ROWS is supported");
	}
	if (!stmt.tableElts) {
		throw ParserException("Table must have at least one column!");
	}

	idx_t column_count = 0;
	for (auto c = stmt.tableElts->head; c != nullptr; c = lnext(c)) {
		auto node = PGPointerCast<duckdb_libpgquery::PGNode>(c->data.ptr_value);
		switch (node->type) {
		case duckdb_libpgquery::T_PGColumnDef: {
			auto pg_col_def = PGPointerCast<duckdb_libpgquery::PGColumnDef>(c->data.ptr_value);
			auto col_def = TransformColumnDefinition(*pg_col_def);

			if (pg_col_def->constraints) {
				for (auto cell = pg_col_def->constraints->head; cell != nullptr; cell = cell->next) {
					auto pg_constraint = PGPointerCast<duckdb_libpgquery::PGConstraint>(cell->data.ptr_value);
					auto constraint = TransformConstraint(*pg_constraint, col_def, info->columns.LogicalColumnCount());
					if (constraint) {
						info->constraints.push_back(std::move(constraint));
					}
				}
			}

			info->columns.AddColumn(std::move(col_def));
			column_count++;
			break;
		}
		case duckdb_libpgquery::T_PGConstraint: {
			auto pg_constraint = PGPointerCast<duckdb_libpgquery::PGConstraint>(c->data.ptr_value);
			info->constraints.push_back(TransformConstraint(*pg_constraint));
			break;
		}
		default:
			throw NotImplementedException("ColumnDef type not handled yet");
		}
	}

	if (!column_count) {
		throw ParserException("Table must have at least one column!");
	}

	result->info = std::move(info);
	return result;
}